

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O2

Nodo * __thiscall Lista<int>::iesimoNodo(Lista<int> *this,Nat i)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = i == 0;
    i = i - 1;
    if (bVar1) break;
    this = (Lista<int> *)&this->_prim->_sig;
  }
  return this->_prim;
}

Assistant:

typename Lista<T>::Nodo* Lista<T>::iesimoNodo(Nat i) const {
    Nodo* actual = this->_prim;
    int posicion = 0;
    while(posicion != i) {
        actual = actual->_sig;
        posicion++;
    }

    return actual;
}